

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  int iVar1;
  Symbol *this_00;
  Scope *pSVar2;
  Expression *pEVar3;
  SubroutineSymbol *pSVar4;
  ClockVarSymbol *pCVar5;
  DiagCode DVar6;
  undefined4 in_register_0000000c;
  DiagCode code;
  bool bVar7;
  anon_class_32_4_231050bc reportErr;
  anon_class_32_4_231050bc local_58;
  SourceLocation local_38;
  SourceRange local_30;
  
  local_38._4_4_ = in_register_0000000c;
  local_38._0_4_ = flags.m_bits;
  local_58.assignLoc = &local_38;
  local_58.varRange = &local_30;
  local_58.context = (ASTContext *)this;
  local_58.var = (VariableSymbol *)context;
  local_30.startLoc = assignLoc;
  if (((ulong)context[2].instanceOrProc & 0x100000000) != 0) {
    pSVar2 = not_null<const_slang::ast::Scope_*>::get((not_null<const_slang::ast::Scope_*> *)this);
    while (this_00 = pSVar2->thisSym, this_00->kind == StatementBlock) {
      pSVar2 = this_00->parentScope;
      if (pSVar2 == (Scope *)0x0) {
        assert::assertFailed
                  ("parentScope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/MiscExpressions.cpp"
                   ,200,
                   "static bool slang::ast::ValueExpressionBase::checkVariableAssignment(const ASTContext &, const VariableSymbol &, bitmask<AssignFlags>, SourceLocation, SourceRange)"
                  );
      }
    }
    pEVar3 = DeclaredType::getInitializer((DeclaredType *)&context[1].lookupIndex);
    code.subsystem = Expressions;
    code.code = 0x17;
    if (((pEVar3 != (Expression *)0x0) || (this_00->kind != Subroutine)) ||
       (pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>(this_00),
       ((pSVar4->flags).m_bits & 8) == 0)) goto LAB_0031687d;
  }
  iVar1 = *(int *)&(context->scope).ptr;
  if ((((ulong)var & 1) == 0) || (*(int *)&context[2].instanceOrProc != 0)) {
    if (iVar1 == 0x51) {
      if (((ulong)var & 2) != 0) {
        checkVariableAssignment::anon_class_32_4_231050bc::operator()(&local_58,(DiagCode)0x360007);
      }
      pCVar5 = Symbol::as<slang::ast::ClockVarSymbol>((Symbol *)context);
      bVar7 = pCVar5->direction == In;
      DVar6.subsystem = Statements;
      DVar6.code = 9;
      code.subsystem = Statements;
      code.code = 0x4b;
      if (!bVar7) {
        code = DVar6;
      }
      if (bVar7 || ((ulong)var & 1) == 0) goto LAB_0031687d;
    }
  }
  else {
    code.subsystem = Expressions;
    code.code = 0x72;
    if (iVar1 != 0x3d) goto LAB_0031687d;
  }
  code.subsystem = Expressions;
  code.code = 0x4f;
  if (((ulong)var & 0x10) == 0) {
    return true;
  }
LAB_0031687d:
  checkVariableAssignment::anon_class_32_4_231050bc::operator()(&local_58,code);
  return false;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}